

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void __thiscall
cmCacheManager::CacheEntry::AppendProperty(CacheEntry *this,string *prop,char *value,bool asString)

{
  bool bVar1;
  CacheEntryType CVar2;
  ulong uVar3;
  char *local_38;
  bool asString_local;
  char *value_local;
  string *prop_local;
  CacheEntry *this_local;
  
  bVar1 = std::operator==(prop,"TYPE");
  if (bVar1) {
    local_38 = value;
    if (value == (char *)0x0) {
      local_38 = "STRING";
    }
    CVar2 = cmState::StringToCacheEntryType(local_38);
    this->Type = CVar2;
  }
  else {
    bVar1 = std::operator==(prop,"VALUE");
    if (bVar1) {
      if (value != (char *)0x0) {
        uVar3 = std::__cxx11::string::empty();
        if ((((uVar3 & 1) == 0) && (*value != '\0')) && (!asString)) {
          std::__cxx11::string::operator+=((string *)this,";");
        }
        std::__cxx11::string::operator+=((string *)this,value);
      }
    }
    else {
      cmPropertyMap::AppendProperty(&this->Properties,prop,value,asString);
    }
  }
  return;
}

Assistant:

void cmCacheManager::CacheEntry::AppendProperty(const std::string& prop,
                                                const char* value,
                                                bool asString)
{
  if (prop == "TYPE") {
    this->Type = cmState::StringToCacheEntryType(value ? value : "STRING");
  } else if (prop == "VALUE") {
    if (value) {
      if (!this->Value.empty() && *value && !asString) {
        this->Value += ";";
      }
      this->Value += value;
    }
  } else {
    this->Properties.AppendProperty(prop, value, asString);
  }
}